

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O1

int cuddResizeTableZdd(DdManager *unique,int index)

{
  DdSubtable *pDVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  void *__s;
  DdSubtable *pDVar8;
  int *piVar9;
  int *piVar10;
  DdNode **ppDVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  uint *puVar15;
  long lVar16;
  long lVar17;
  
  iVar4 = unique->maxSizeZ;
  uVar12 = unique->initSlots;
  uVar5 = unique->sizeZ;
  lVar7 = (long)(int)uVar5;
  if (index < iVar4) {
    if ((int)uVar5 <= index) {
      sVar14 = (ulong)uVar12 * 8;
      lVar16 = lVar7 * 0x38;
      lVar17 = 0;
      do {
        *(uint *)((long)&unique->subtableZ->slots + lVar16) = uVar12;
        iVar4 = cuddComputeFloorLog2(uVar12);
        pDVar8 = unique->subtableZ;
        *(int *)((long)&pDVar8->shift + lVar16) = 0x20 - iVar4;
        *(undefined4 *)((long)&pDVar8->keys + lVar16) = 0;
        *(uint *)((long)&pDVar8->maxKeys + lVar16) = uVar12 * 4;
        *(undefined4 *)((long)&pDVar8->dead + lVar16) = 0;
        iVar4 = uVar5 + (int)lVar17;
        unique->permZ[lVar7 + lVar17] = iVar4;
        unique->invpermZ[lVar7 + lVar17] = iVar4;
        __s = malloc(sVar14);
        *(void **)((long)&pDVar8->nodelist + lVar16) = __s;
        if (__s == (void *)0x0) goto LAB_00806fc7;
        if (uVar12 != 0) {
          memset(__s,0,sVar14);
        }
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x38;
      } while (uVar5 + ~index + (int)lVar17 != 0);
    }
LAB_00806f1c:
    uVar5 = ((index + 1) - unique->sizeZ) * uVar12 + unique->slots;
    unique->slots = uVar5;
    unique->minDead = (uint)(long)((double)uVar5 * unique->gcFrac);
    uVar12 = unique->maxCacheHard;
    if (uVar5 * 4 < unique->maxCacheHard) {
      uVar12 = uVar5 * 4;
    }
    iVar4 = uVar12 + unique->cacheSlots * -2;
    unique->cacheSlack = iVar4;
    if (-1 < iVar4 && unique->cacheSlots < uVar5 >> 1) {
      cuddCacheResize(unique);
    }
    unique->sizeZ = index + 1;
    iVar4 = unique->autoDynZ;
    unique->autoDynZ = 0;
    cuddZddFreeUniv(unique);
    iVar6 = cuddZddInitUniv(unique);
    uVar12 = (uint)(iVar6 != 0);
    unique->autoDynZ = iVar4;
  }
  else {
    iVar6 = index + 10;
    pDVar8 = (DdSubtable *)malloc((long)iVar6 * 0x38);
    if (pDVar8 != (DdSubtable *)0x0) {
      sVar14 = (long)iVar6 << 2;
      piVar9 = (int *)malloc(sVar14);
      if ((piVar9 != (int *)0x0) && (piVar10 = (int *)malloc(sVar14), piVar10 != (int *)0x0)) {
        unique->memused = unique->memused + ((ulong)(uVar12 + 1) * 8 + 0x40) * (long)(iVar6 - iVar4)
        ;
        if (unique->maxSize < iVar6) {
          if (unique->stack != (DdNode **)0x0) {
            free(unique->stack);
            unique->stack = (DdNode **)0x0;
          }
          ppDVar11 = (DdNode **)malloc((long)index * 8 + 0x58);
          unique->stack = ppDVar11;
          if (ppDVar11 == (DdNode **)0x0) goto LAB_00806fc7;
          *ppDVar11 = (DdNode *)0x0;
          iVar4 = unique->maxSize;
          if (unique->maxSize < unique->maxSizeZ) {
            iVar4 = unique->maxSizeZ;
          }
          unique->memused = unique->memused + (long)(iVar6 - iVar4) * 8;
        }
        if (0 < (int)uVar5) {
          pDVar1 = unique->subtableZ;
          piVar2 = unique->permZ;
          piVar3 = unique->invpermZ;
          lVar7 = 6;
          uVar13 = 0;
          do {
            *(undefined4 *)((long)pDVar8 + lVar7 * 4 + -0xc) =
                 *(undefined4 *)((long)pDVar1 + lVar7 * 4 + -0xc);
            *(undefined4 *)((long)pDVar8 + lVar7 * 4 + -0x10) =
                 *(undefined4 *)((long)pDVar1 + lVar7 * 4 + -0x10);
            *(undefined4 *)((long)pDVar8 + lVar7 * 4 + -8) =
                 *(undefined4 *)((long)pDVar1 + lVar7 * 4 + -8);
            *(undefined4 *)((long)pDVar8 + lVar7 * 4 + -4) =
                 *(undefined4 *)((long)pDVar1 + lVar7 * 4 + -4);
            *(undefined4 *)((long)&pDVar8->nodelist + lVar7 * 4) =
                 *(undefined4 *)((long)&pDVar1->nodelist + lVar7 * 4);
            *(undefined8 *)((long)pDVar8 + lVar7 * 4 + -0x18) =
                 *(undefined8 *)((long)pDVar1 + lVar7 * 4 + -0x18);
            piVar9[uVar13] = piVar2[uVar13];
            piVar10[uVar13] = piVar3[uVar13];
            uVar13 = uVar13 + 1;
            lVar7 = lVar7 + 0xe;
          } while (uVar5 != uVar13);
        }
        if ((int)uVar5 <= index) {
          sVar14 = (ulong)uVar12 * 8;
          puVar15 = &pDVar8[(int)uVar5].dead;
          lVar7 = 0;
          do {
            puVar15[-3] = uVar12;
            iVar4 = cuddComputeFloorLog2(uVar12);
            puVar15[-4] = 0x20 - iVar4;
            puVar15[-2] = 0;
            puVar15[-1] = uVar12 * 4;
            *puVar15 = 0;
            iVar4 = uVar5 + (int)lVar7;
            piVar9[(int)uVar5 + lVar7] = iVar4;
            piVar10[(int)uVar5 + lVar7] = iVar4;
            ppDVar11 = (DdNode **)malloc(sVar14);
            ((DdSubtable *)(puVar15 + -6))->nodelist = ppDVar11;
            if (ppDVar11 == (DdNode **)0x0) goto LAB_00806fc7;
            if (uVar12 != 0) {
              memset(ppDVar11,0,sVar14);
            }
            lVar7 = lVar7 + 1;
            puVar15 = puVar15 + 0xe;
          } while (~index + uVar5 + (int)lVar7 != 0);
        }
        if (unique->subtableZ != (DdSubtable *)0x0) {
          free(unique->subtableZ);
          unique->subtableZ = (DdSubtable *)0x0;
        }
        unique->subtableZ = pDVar8;
        unique->maxSizeZ = iVar6;
        if (unique->permZ != (int *)0x0) {
          free(unique->permZ);
          unique->permZ = (int *)0x0;
        }
        unique->permZ = piVar9;
        if (unique->invpermZ != (int *)0x0) {
          free(unique->invpermZ);
          unique->invpermZ = (int *)0x0;
        }
        unique->invpermZ = piVar10;
        goto LAB_00806f1c;
      }
    }
LAB_00806fc7:
    unique->errorCode = CUDD_MEMORY_OUT;
    uVar12 = 0;
  }
  return uVar12;
}

Assistant:

int
cuddResizeTableZdd(
  DdManager * unique,
  int  index)
{
    DdSubtable *newsubtables;
    DdNodePtr *newnodelist;
    int oldsize,newsize;
    int i,j,reorderSave;
    unsigned int numSlots = unique->initSlots;
    int *newperm, *newinvperm;

    oldsize = unique->sizeZ;
    /* Easy case: there is still room in the current table. */
    if (index < unique->maxSizeZ) {
        for (i = oldsize; i <= index; i++) {
            unique->subtableZ[i].slots = numSlots;
            unique->subtableZ[i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            unique->subtableZ[i].keys = 0;
            unique->subtableZ[i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            unique->subtableZ[i].dead = 0;
            unique->permZ[i] = i;
            unique->invpermZ[i] = i;
            newnodelist = unique->subtableZ[i].nodelist =
                ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = NULL;
            }
        }
    } else {
        /* The current table is too small: we need to allocate a new,
        ** larger one; move all old subtables, and initialize the new
        ** subtables up to index included.
        */
        newsize = index + DD_DEFAULT_RESIZE;
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "Increasing the ZDD table size from %d to %d\n",
            unique->maxSizeZ, newsize);
#endif
        newsubtables = ABC_ALLOC(DdSubtable,newsize);
        if (newsubtables == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        newperm = ABC_ALLOC(int,newsize);
        if (newperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        newinvperm = ABC_ALLOC(int,newsize);
        if (newinvperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        unique->memused += (newsize - unique->maxSizeZ) * ((numSlots+1) *
            sizeof(DdNode *) + 2 * sizeof(int) + sizeof(DdSubtable));
        if (newsize > unique->maxSize) {
            ABC_FREE(unique->stack);
            unique->stack = ABC_ALLOC(DdNodePtr,newsize + 1);
            if (unique->stack == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            unique->stack[0] = NULL; /* to suppress harmless UMR */
            unique->memused +=
                (newsize - ddMax(unique->maxSize,unique->maxSizeZ))
                * sizeof(DdNode *);
        }
        for (i = 0; i < oldsize; i++) {
            newsubtables[i].slots = unique->subtableZ[i].slots;
            newsubtables[i].shift = unique->subtableZ[i].shift;
            newsubtables[i].keys = unique->subtableZ[i].keys;
            newsubtables[i].maxKeys = unique->subtableZ[i].maxKeys;
            newsubtables[i].dead = unique->subtableZ[i].dead;
            newsubtables[i].nodelist = unique->subtableZ[i].nodelist;
            newperm[i] = unique->permZ[i];
            newinvperm[i] = unique->invpermZ[i];
        }
        for (i = oldsize; i <= index; i++) {
            newsubtables[i].slots = numSlots;
            newsubtables[i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            newsubtables[i].keys = 0;
            newsubtables[i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            newsubtables[i].dead = 0;
            newperm[i] = i;
            newinvperm[i] = i;
            newnodelist = newsubtables[i].nodelist = ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = NULL;
            }
        }
        ABC_FREE(unique->subtableZ);
        unique->subtableZ = newsubtables;
        unique->maxSizeZ = newsize;
        ABC_FREE(unique->permZ);
        unique->permZ = newperm;
        ABC_FREE(unique->invpermZ);
        unique->invpermZ = newinvperm;
    }
    unique->slots += (index + 1 - unique->sizeZ) * numSlots;
    ddFixLimits(unique);
    unique->sizeZ = index + 1;

    /* Now that the table is in a coherent state, update the ZDD
    ** universe. We need to temporarily disable reordering,
    ** because we cannot reorder without universe in place.
    */

    reorderSave = unique->autoDynZ;
    unique->autoDynZ = 0;
    cuddZddFreeUniv(unique);
    if (!cuddZddInitUniv(unique)) {
        unique->autoDynZ = reorderSave;
        return(0);
    }
    unique->autoDynZ = reorderSave;

    return(1);

}